

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall irr::video::COpenGLDriver::uploadClipPlane(COpenGLDriver *this,u32 index)

{
  SUserClipPlane *pSVar1;
  int in_ESI;
  array<irr::video::COpenGLDriver::SUserClipPlane> *in_RDI;
  GLdouble clip_plane [4];
  u32 in_stack_ffffffffffffffbc;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  int local_c;
  
  local_c = in_ESI;
  pSVar1 = core::array<irr::video::COpenGLDriver::SUserClipPlane>::operator[]
                     (in_RDI,in_stack_ffffffffffffffbc);
  local_38 = (double)(pSVar1->Plane).Normal.X;
  pSVar1 = core::array<irr::video::COpenGLDriver::SUserClipPlane>::operator[]
                     (in_RDI,in_stack_ffffffffffffffbc);
  local_30 = (double)(pSVar1->Plane).Normal.Y;
  pSVar1 = core::array<irr::video::COpenGLDriver::SUserClipPlane>::operator[]
                     (in_RDI,in_stack_ffffffffffffffbc);
  local_28 = (double)(pSVar1->Plane).Normal.Z;
  pSVar1 = core::array<irr::video::COpenGLDriver::SUserClipPlane>::operator[]
                     (in_RDI,in_stack_ffffffffffffffbc);
  local_20 = (double)(pSVar1->Plane).D;
  glClipPlane(local_c + 0x3000,&local_38);
  return;
}

Assistant:

void COpenGLDriver::uploadClipPlane(u32 index)
{
	// opengl needs an array of doubles for the plane equation
	GLdouble clip_plane[4];
	clip_plane[0] = UserClipPlanes[index].Plane.Normal.X;
	clip_plane[1] = UserClipPlanes[index].Plane.Normal.Y;
	clip_plane[2] = UserClipPlanes[index].Plane.Normal.Z;
	clip_plane[3] = UserClipPlanes[index].Plane.D;
	glClipPlane(GL_CLIP_PLANE0 + index, clip_plane);
}